

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O3

void mapVoronoiZoom(Layer *l,int *out,longlong areaX,longlong areaZ,int areaWidth,int areaHeight)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *__ptr;
  long lVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  void *__src;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  
  uVar9 = (int)areaX - 2;
  uVar28 = (int)areaZ - 2;
  iVar10 = (int)uVar9 >> 2;
  iVar29 = (int)uVar28 >> 2;
  iVar2 = areaWidth >> 2;
  iVar3 = iVar2 + 2;
  uVar25 = areaWidth & 0xfffffffc;
  iVar13 = areaHeight >> 2;
  __ptr = malloc((long)(int)(((areaHeight & 0xfffffffcU) + 5) * (uVar25 + 5)) << 2);
  (*l->p->getMap)(l->p,out,(long)iVar10,(long)iVar29,iVar3,iVar13 + 2);
  if (-1 < iVar13) {
    iVar26 = uVar25 + 4;
    iVar19 = 0;
    uVar27 = 0;
    do {
      uVar7 = uVar27 + 1;
      if (-1 < iVar2) {
        iVar4 = (int)uVar27 + iVar29;
        lVar8 = (long)(iVar4 * 4);
        lVar1 = l->worldSeed;
        lVar21 = (lVar1 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar1;
        lVar6 = (long)(iVar4 * 4 + 4);
        uVar30 = 0;
        uVar11 = out[uVar7 * (long)iVar3];
        uVar15 = out[uVar27 * (long)iVar3];
        iVar4 = iVar19;
        do {
          iVar5 = iVar10 + (int)uVar30;
          lVar24 = (long)(iVar5 * 4);
          lVar14 = lVar21 + lVar24;
          lVar14 = (lVar14 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar14;
          lVar22 = lVar14 + lVar8;
          lVar22 = (lVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar22 + lVar24;
          lVar17 = (lVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar22 + lVar8;
          lVar23 = (long)(iVar5 * 4 + 4);
          lVar22 = lVar21 + lVar23;
          lVar22 = (lVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar22;
          lVar18 = lVar22 + lVar8;
          lVar18 = (lVar18 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar18 + lVar23;
          lVar18 = (lVar18 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar18 + lVar8;
          lVar14 = lVar14 + lVar6;
          lVar24 = (lVar14 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar14 + lVar24;
          lVar14 = (lVar24 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar24 + lVar6;
          lVar22 = lVar22 + lVar6;
          lVar23 = (lVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar22 + lVar23;
          lVar22 = (lVar23 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar23 + lVar6;
          lVar24 = (lVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar22 + lVar1;
          uVar16 = (uint)(byte)(out + uVar27 * (long)iVar3)[uVar30 + 1];
          uVar12 = (uint)(byte)(out + uVar7 * (long)iVar3)[uVar30 + 1];
          uVar30 = uVar30 + 1;
          iVar20 = 0;
          dVar36 = 0.0;
          iVar5 = iVar4;
          do {
            dVar31 = dVar36 - ((double)((uint)((ulong)((lVar17 * 0x51f42d4c957f2d + 0x2f767814f) *
                                                       lVar17 + lVar1) >> 0x18) & 0x3ff) *
                               0.0009765625 + -0.5) * 3.6;
            dVar32 = dVar36 - ((double)((uint)((ulong)((lVar18 * 0x51f42d4c957f2d + 0x2f767814f) *
                                                       lVar18 + lVar1) >> 0x18) & 0x3ff) *
                               0.0009765625 + -0.5) * 3.6;
            dVar34 = dVar36 - (((double)((uint)((ulong)((lVar14 * 0x51f42d4c957f2d + 0x2f767814f) *
                                                        lVar14 + lVar1) >> 0x18) & 0x3ff) *
                                0.0009765625 + -0.5) * 3.6 + 4.0);
            dVar35 = dVar36 - (((double)((uint)((ulong)lVar24 >> 0x18) & 0x3ff) * 0.0009765625 +
                               -0.5) * 3.6 + 4.0);
            lVar23 = 0;
            dVar37 = 0.0;
            do {
              dVar33 = dVar37 - ((double)((uint)((ulong)lVar17 >> 0x18) & 0x3ff) * 0.0009765625 +
                                -0.5) * 3.6;
              dVar39 = dVar31 * dVar31 + dVar33 * dVar33;
              dVar33 = dVar37 - (((double)((uint)((ulong)lVar18 >> 0x18) & 0x3ff) * 0.0009765625 +
                                 -0.5) * 3.6 + 4.0);
              dVar40 = dVar32 * dVar32 + dVar33 * dVar33;
              dVar33 = dVar37 - ((double)((uint)((ulong)lVar14 >> 0x18) & 0x3ff) * 0.0009765625 +
                                -0.5) * 3.6;
              dVar38 = dVar34 * dVar34 + dVar33 * dVar33;
              dVar33 = dVar37 - (((double)((uint)((ulong)lVar22 >> 0x18) & 0x3ff) * 0.0009765625 +
                                 -0.5) * 3.6 + 4.0);
              dVar33 = dVar35 * dVar35 + dVar33 * dVar33;
              if (((dVar40 <= dVar39) || (dVar38 <= dVar39)) || (dVar33 <= dVar39)) {
                if (((dVar39 <= dVar40) || (dVar38 <= dVar40)) || (dVar33 <= dVar40)) {
                  if (((dVar39 <= dVar38) || (dVar40 <= dVar38)) || (dVar33 <= dVar38)) {
                    *(uint *)((long)__ptr + lVar23 * 4 + (long)iVar5 * 4) = uVar12;
                  }
                  else {
                    *(uint *)((long)__ptr + lVar23 * 4 + (long)iVar5 * 4) = uVar11;
                  }
                }
                else {
                  *(uint *)((long)__ptr + lVar23 * 4 + (long)iVar5 * 4) = uVar16;
                }
              }
              else {
                *(uint *)((long)__ptr + lVar23 * 4 + (long)iVar5 * 4) = uVar15;
              }
              dVar37 = dVar37 + 1.0;
              lVar23 = lVar23 + 1;
            } while ((int)lVar23 != 4);
            dVar36 = dVar36 + 1.0;
            iVar20 = iVar20 + 1;
            iVar5 = iVar5 + iVar26;
          } while (iVar20 != 4);
          iVar4 = iVar4 + 4;
          uVar11 = uVar12;
          uVar15 = uVar16;
        } while (uVar30 != iVar2 + 1);
        l->chunkSeed = (lVar24 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar24 + lVar1;
      }
      iVar19 = iVar19 + uVar25 * 4 + 0x10;
      uVar27 = uVar7;
    } while (uVar7 != iVar13 + 1);
    if (0 < areaHeight) {
      uVar27 = (ulong)(uint)areaHeight;
      __src = (void *)(((ulong)(uVar28 & 3) * (long)iVar26 + (ulong)(uVar9 & 3)) * 4 + (long)__ptr);
      do {
        memcpy(out,__src,(long)areaWidth * 4);
        out = out + areaWidth;
        __src = (void *)((long)__src + (long)iVar26 * 4);
        uVar27 = uVar27 - 1;
      } while (uVar27 != 0);
    }
  }
  free(__ptr);
  return;
}

Assistant:

void mapVoronoiZoom(Layer *l, int *__restrict out, long long areaX, long long areaZ, int areaWidth, int areaHeight) {
    areaX -= 2;
    areaZ -= 2;
    int pX = (int) areaX >> 2;
    int pZ = (int) areaZ >> 2;
    int pWidth = (areaWidth >> 2) + 2;
    int pHeight = (areaHeight >> 2) + 2;
    int newWidth = (pWidth - 1) << 2;
    int newHeight = (pHeight - 1) << 2;
    int x, z, i, j;
    int *buf = (int *) malloc((newWidth + 1) * (newHeight + 1) * sizeof(*buf));

    l->p->getMap(l->p, out, pX, pZ, pWidth, pHeight);

    for (z = 0; z < pHeight - 1; z++) {
        int v00 = out[(z + 0) * pWidth];
        int v01 = out[(z + 1) * pWidth];

        for (x = 0; x < pWidth - 1; x++) {
            setChunkSeed(l, (x + pX) << 2, (z + pZ) << 2);
            double da1 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6;
            double da2 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6;

            setChunkSeed(l, (x + pX + 1) << 2, (z + pZ) << 2);
            double db1 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6 + 4.0;
            double db2 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6;

            setChunkSeed(l, (x + pX) << 2, (z + pZ + 1) << 2);
            double dc1 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6;
            double dc2 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6 + 4.0;

            setChunkSeed(l, (x + pX + 1) << 2, (z + pZ + 1) << 2);
            double dd1 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6 + 4.0;
            double dd2 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6 + 4.0;

            int v10 = out[x + 1 + (z + 0) * pWidth] & 255;
            int v11 = out[x + 1 + (z + 1) * pWidth] & 255;

            for (j = 0; j < 4; j++) {
                int idx = ((z << 2) + j) * newWidth + (x << 2);

                for (i = 0; i < 4; i++) {
                    double da = (j - da2) * (j - da2) + (i - da1) * (i - da1);
                    double db = (j - db2) * (j - db2) + (i - db1) * (i - db1);
                    double dc = (j - dc2) * (j - dc2) + (i - dc1) * (i - dc1);
                    double dd = (j - dd2) * (j - dd2) + (i - dd1) * (i - dd1);

                    if (da < db && da < dc && da < dd) {
                        buf[idx++] = v00;
                    } else if (db < da && db < dc && db < dd) {
                        buf[idx++] = v10;
                    } else if (dc < da && dc < db && dc < dd) {
                        buf[idx++] = v01;
                    } else {
                        buf[idx++] = v11;
                    }
                }
            }

            v00 = v10;
            v01 = v11;
        }
    }

    for (z = 0; z < areaHeight; z++) {
        memcpy(&out[z * areaWidth], &buf[(z + (areaZ & 3)) * newWidth + (areaX & 3)], areaWidth * sizeof(int));
    }

    free(buf);
}